

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall CppGenerator::computeParallelizeGroup(CppGenerator *this,bool paralleize_groups)

{
  TreeDecomposition *this_00;
  uint uVar1;
  ulong uVar2;
  bool *__s;
  size_t *__s_00;
  View *pVVar3;
  TDNode *pTVar4;
  ulong uVar5;
  pointer pvVar6;
  undefined7 in_register_00000031;
  size_t gid;
  pointer pvVar7;
  long lVar8;
  
  pvVar6 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = ((long)pvVar7 - (long)pvVar6) / 0x18;
  __s = (bool *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  this->_parallelizeGroup = __s;
  uVar2 = -(ulong)(uVar2 >> 0x3d != 0) | uVar2 << 3;
  __s_00 = (size_t *)operator_new__(uVar2);
  memset(__s_00,0,uVar2);
  this->_threadsPerGroup = __s_00;
  if ((int)CONCAT71(in_register_00000031,paralleize_groups) != 0) {
    lVar8 = 0;
    for (uVar2 = 0; uVar2 < (ulong)(((long)pvVar7 - (long)pvVar6) / 0x18); uVar2 = uVar2 + 1) {
      this_00 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      pVVar3 = QueryCompiler::getView
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,**(size_t **)
                                   ((long)&(pvVar6->
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           )._M_impl.super__Vector_impl_data + lVar8));
      pTVar4 = TreeDecomposition::getRelation(this_00,(ulong)pVVar3->_origin);
      if (1 < pTVar4->_threads) {
        this->_parallelizeGroup[uVar2] = true;
        uVar1 = std::thread::hardware_concurrency();
        uVar5 = (ulong)uVar1;
        if (pTVar4->_threads < (ulong)uVar1) {
          uVar5 = pTVar4->_threads;
        }
        this->_threadsPerGroup[uVar2] = uVar5;
      }
      pvVar6 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar7 = (this->viewGroups).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar8 = lVar8 + 0x18;
    }
  }
  return;
}

Assistant:

void CppGenerator::computeParallelizeGroup(bool paralleize_groups)
{
    _parallelizeGroup = new bool[viewGroups.size()]();
    _threadsPerGroup = new size_t[viewGroups.size()]();

    if (!paralleize_groups)
        return;
    
    for (size_t gid = 0; gid < viewGroups.size(); ++gid)
    {
        TDNode* node = _td->getRelation(_qc->getView(viewGroups[gid][0])->_origin);

        if (node->_threads > 1)
        {
            _parallelizeGroup[gid] = true;            
            _threadsPerGroup[gid] =
                std::min(node->_threads, (size_t)std::thread::hardware_concurrency());
        }        
    }
}